

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_SetupBackwardInit(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  MinRegMan_t *pMVar2;
  Vec_Ptr_t *vFanins;
  void **ppvVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Abc_NtkFunc_t Func;
  Abc_NtkType_t Type;
  long lVar12;
  ulong local_40;
  
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFanins->pArray = ppvVar3;
  Type = pNtk->ntkType;
  if (Type == ABC_NTK_STRASH) {
    Type = ABC_NTK_LOGIC;
  }
  else {
    Func = pNtk->ntkFunc;
    if (Func != ABC_FUNC_MAP) goto LAB_004daa2e;
  }
  Func = ABC_FUNC_SOP;
LAB_004daa2e:
  pAVar4 = Abc_NtkAlloc(Type,Func,1);
  pManMR->pInitNtk = pAVar4;
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    uVar9 = 0;
    local_40 = 100;
    uVar11 = 100;
    lVar12 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar12];
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
        pAVar5 = Abc_NtkCreateObj(pManMR->pInitNtk,ABC_OBJ_PI);
        if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
        }
        if (*(long *)((long)pvVar1 + 0x38) == 2) {
          uVar10 = (uint)uVar11;
          pAVar6 = pAVar5;
          if (uVar9 == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (vFanins->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(vFanins->pArray,0x80);
              }
              vFanins->pArray = ppvVar3;
              vFanins->nCap = 0x10;
LAB_004dabf7:
              local_40 = 0x10;
              uVar11 = 0x10;
            }
            else {
              uVar10 = uVar10 * 2;
              uVar11 = (ulong)uVar10;
              if (vFanins->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(uVar11 * 8);
              }
              else {
                ppvVar3 = (void **)realloc(vFanins->pArray,uVar11 * 8);
              }
              vFanins->pArray = ppvVar3;
              vFanins->nCap = uVar10;
              local_40 = (ulong)uVar10;
            }
          }
          else {
            ppvVar3 = vFanins->pArray;
          }
LAB_004dac1d:
          lVar8 = (long)(int)uVar9;
          uVar9 = uVar9 + 1;
          vFanins->nSize = uVar9;
          ppvVar3[lVar8] = pAVar6;
        }
        else if (*(long *)((long)pvVar1 + 0x38) == 1) {
          pAVar6 = Abc_NtkCreateNodeInv(pManMR->pInitNtk,pAVar5);
          uVar10 = (uint)local_40;
          if (uVar9 == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (vFanins->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(vFanins->pArray,0x80);
              }
              vFanins->pArray = ppvVar3;
              vFanins->nCap = 0x10;
              goto LAB_004dabf7;
            }
            uVar10 = uVar10 * 2;
            local_40 = (ulong)uVar10;
            if (vFanins->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(local_40 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(vFanins->pArray,local_40 * 8);
            }
            vFanins->pArray = ppvVar3;
            vFanins->nCap = uVar10;
          }
          else {
            ppvVar3 = vFanins->pArray;
          }
          uVar11 = (ulong)uVar10;
          goto LAB_004dac1d;
        }
        *(Abc_Obj_t **)((long)pvVar1 + 0x38) = pAVar5;
        pVVar7 = pNtk->vBoxes;
      }
      pMVar2 = pManMR;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
    if (uVar9 != 0) {
      pManMR->fSolutionIsDc = 0;
      pAVar5 = Abc_NtkCreateNodeAnd(pMVar2->pInitNtk,vFanins);
      pAVar6 = Abc_NtkCreateObj(pManMR->pInitNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar6,pAVar5);
      if (vFanins->pArray != (void **)0x0) {
        free(vFanins->pArray);
      }
      free(vFanins);
      return;
    }
  }
  pManMR->fSolutionIsDc = 1;
  return;
}

Assistant:

void Abc_FlowRetime_SetupBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pLatch, *pObj, *pPi;
  int i;
  Vec_Ptr_t *vObj = Vec_PtrAlloc(100);

  // create the network used for the initial state computation
  if (Abc_NtkIsStrash(pNtk)) {
    pManMR->pInitNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
  } else if (Abc_NtkHasMapping(pNtk))
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, ABC_FUNC_SOP, 1 );
  else
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );

  // mitre inputs
  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    // map latch to initial state network
    pPi = Abc_NtkCreatePi( pManMR->pInitNtk );

    // DEBUG
    // printf("setup : mapping latch %d to PI %d\n", pLatch->Id, pPi->Id);

    // has initial state requirement?
    if (Abc_LatchIsInit0(pLatch)) {
      pObj = Abc_NtkCreateNodeInv( pManMR->pInitNtk, pPi );
      Vec_PtrPush(vObj, pObj);
    }
    else if (Abc_LatchIsInit1(pLatch)) {
      Vec_PtrPush(vObj, pPi);
    }
    
    Abc_ObjSetData( pLatch, pPi );     // if not verifying init state
    // FDATA(pLatch)->pInitObj = pPi;  // if verifying init state
  }

  // are there any nodes not DC?
  if (!Vec_PtrSize(vObj)) {
    pManMR->fSolutionIsDc = 1;
    return;
  } else 
    pManMR->fSolutionIsDc = 0;

  // mitre output

  // create n-input AND gate
  pObj = Abc_NtkCreateNodeAnd( pManMR->pInitNtk, vObj );

  Abc_ObjAddFanin( Abc_NtkCreatePo( pManMR->pInitNtk ), pObj );

  Vec_PtrFree( vObj );
}